

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFullTypeName(ParserImpl *this,string *name)

{
  bool bVar1;
  undefined1 local_78 [8];
  string part;
  allocator local_41;
  string local_40;
  string *local_20;
  string *name_local;
  ParserImpl *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  bVar1 = ConsumeIdentifier(this,name);
  if (bVar1) {
    do {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_40,".",&local_41);
      bVar1 = TryConsume(this,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      if (!bVar1) {
        this_local._7_1_ = 1;
        break;
      }
      std::__cxx11::string::string((string *)local_78);
      bVar1 = ConsumeIdentifier(this,(string *)local_78);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)local_20,".");
        std::__cxx11::string::operator+=((string *)local_20,(string *)local_78);
      }
      else {
        this_local._7_1_ = 0;
      }
      std::__cxx11::string::~string((string *)local_78);
    } while (bVar1);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ConsumeFullTypeName(std::string* name) {
    DO(ConsumeIdentifier(name));
    while (TryConsume(".")) {
      std::string part;
      DO(ConsumeIdentifier(&part));
      *name += ".";
      *name += part;
    }
    return true;
  }